

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.cc
# Opt level: O0

void __thiscall
draco::GeometryAttribute::Init
          (GeometryAttribute *this,Type attribute_type,DataBuffer *buffer,uint8_t num_components,
          DataType data_type,bool normalized,int64_t byte_stride,int64_t byte_offset)

{
  int64_t iVar1;
  undefined1 in_CL;
  DataBuffer *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  undefined8 in_stack_00000008;
  undefined7 in_stack_00000010;
  
  *in_RDI = in_RDX;
  if (in_RDX != (DataBuffer *)0x0) {
    iVar1 = DataBuffer::buffer_id(in_RDX);
    in_RDI[1] = iVar1;
    iVar1 = DataBuffer::update_count(in_RDX);
    in_RDI[2] = iVar1;
  }
  *(undefined1 *)(in_RDI + 3) = in_CL;
  *(undefined4 *)((long)in_RDI + 0x1c) = in_R8D;
  *(byte *)(in_RDI + 4) = in_R9B & 1;
  in_RDI[5] = in_stack_00000008;
  in_RDI[6] = CONCAT17(normalized,in_stack_00000010);
  *(undefined4 *)(in_RDI + 7) = in_ESI;
  return;
}

Assistant:

void GeometryAttribute::Init(GeometryAttribute::Type attribute_type,
                             DataBuffer *buffer, uint8_t num_components,
                             DataType data_type, bool normalized,
                             int64_t byte_stride, int64_t byte_offset) {
  buffer_ = buffer;
  if (buffer) {
    buffer_descriptor_.buffer_id = buffer->buffer_id();
    buffer_descriptor_.buffer_update_count = buffer->update_count();
  }
  num_components_ = num_components;
  data_type_ = data_type;
  normalized_ = normalized;
  byte_stride_ = byte_stride;
  byte_offset_ = byte_offset;
  attribute_type_ = attribute_type;
}